

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloexec.c
# Opt level: O1

void cloexec(int fd)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)fd;
  uVar1 = fcntl(fd,1);
  if ((int)uVar1 < 0) {
    cloexec_cold_2();
  }
  else {
    iVar2 = fcntl(fd,2,(ulong)(uVar1 | 1));
    if (-1 < iVar2) {
      return;
    }
  }
  cloexec_cold_1();
  pcVar4 = (char *)(uVar5 & 0xffffffff);
  uVar1 = fcntl((int)uVar5,1);
  if ((int)uVar1 < 0) {
    noncloexec_cold_2();
  }
  else {
    iVar2 = fcntl((int)uVar5,2,(ulong)(uVar1 & 0x7ffffffe));
    if (-1 < iVar2) {
      return;
    }
  }
  noncloexec_cold_1();
  puVar3 = (undefined8 *)safemalloc(1,8,0);
  pcVar4 = dupstr(pcVar4);
  *puVar3 = pcVar4;
  return;
}

Assistant:

void cloexec(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFD);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFD, fdflags | FD_CLOEXEC) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
}